

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_gcd.c
# Opt level: O0

size_t zzAlmostInvMod(word *b,word *a,word *mod,size_t n,void *stack)

{
  bool_t bVar1;
  int iVar2;
  word *b_00;
  word *a_00;
  word wVar3;
  size_t in_RCX;
  word *in_RDX;
  word *in_RSI;
  word *in_RDI;
  word *in_R8;
  word *da;
  word *da0;
  word *v;
  word *u;
  size_t nv;
  size_t nu;
  size_t k;
  size_t in_stack_ffffffffffffff78;
  word *in_stack_ffffffffffffff80;
  word *in_stack_ffffffffffffff88;
  word *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  word *a_01;
  size_t local_40;
  size_t local_38;
  size_t local_30;
  
  local_30 = 0;
  b_00 = in_R8 + in_RCX;
  a_00 = b_00 + in_RCX;
  a_01 = a_00 + in_RCX + 1;
  wwSetW(a_00,in_RCX + 1,1);
  wwSetZero(a_01,in_RCX + 1);
  wwCopy(in_R8,in_RSI,in_RCX);
  wwCopy(b_00,in_RDX,in_RCX);
  local_38 = wwWordSize(in_R8,in_RCX);
  local_40 = in_RCX;
  do {
    bVar1 = zzIsEven(b_00,local_40);
    if (bVar1 == 0) {
      bVar1 = zzIsEven(in_R8,local_38);
      if (bVar1 == 0) {
        iVar2 = wwCmp2(a_01,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                       (size_t)in_stack_ffffffffffffff88);
        if (iVar2 < 1) {
          in_stack_ffffffffffffff80 = in_R8 + local_40;
          in_stack_ffffffffffffff88 = (word *)(local_38 - local_40);
          wVar3 = zzSub2(in_R8,b_00,local_40);
          zzSubW2(in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff88,wVar3);
          wwShLo(in_stack_ffffffffffffff90,(size_t)in_stack_ffffffffffffff88,
                 (size_t)in_stack_ffffffffffffff80);
          local_38 = wwWordSize(in_R8,local_38);
          zzAdd2(a_00,a_01,in_RCX + 1);
          wwShHi(in_stack_ffffffffffffff90,(size_t)in_stack_ffffffffffffff88,
                 (size_t)in_stack_ffffffffffffff80);
        }
        else {
          in_stack_ffffffffffffff90 = b_00 + local_38;
          in_stack_ffffffffffffff98 = local_40 - local_38;
          wVar3 = zzSub2(b_00,in_R8,local_38);
          zzSubW2(in_stack_ffffffffffffff90,in_stack_ffffffffffffff98,wVar3);
          wwShLo(in_stack_ffffffffffffff90,(size_t)in_stack_ffffffffffffff88,
                 (size_t)in_stack_ffffffffffffff80);
          local_40 = wwWordSize(b_00,local_40);
          zzAdd2(a_01,a_00,in_RCX + 1);
          wwShHi(in_stack_ffffffffffffff90,(size_t)in_stack_ffffffffffffff88,
                 (size_t)in_stack_ffffffffffffff80);
        }
      }
      else {
        wwShLo(in_stack_ffffffffffffff90,(size_t)in_stack_ffffffffffffff88,
               (size_t)in_stack_ffffffffffffff80);
        local_38 = wwWordSize(in_R8,local_38);
        wwShHi(in_stack_ffffffffffffff90,(size_t)in_stack_ffffffffffffff88,
               (size_t)in_stack_ffffffffffffff80);
      }
    }
    else {
      wwShLo(in_stack_ffffffffffffff90,(size_t)in_stack_ffffffffffffff88,
             (size_t)in_stack_ffffffffffffff80);
      local_40 = wwWordSize(b_00,local_40);
      wwShHi(in_stack_ffffffffffffff90,(size_t)in_stack_ffffffffffffff88,
             (size_t)in_stack_ffffffffffffff80);
    }
    local_30 = local_30 + 1;
    bVar1 = wwIsZero(in_R8,local_38);
  } while (bVar1 == 0);
  bVar1 = wwIsW(b_00,local_40,1);
  if (bVar1 == 0) {
    wwSetZero(in_RDI,in_RCX);
  }
  iVar2 = wwCmp2(a_01,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                 (size_t)in_stack_ffffffffffffff88);
  if (-1 < iVar2) {
    wVar3 = zzSub2(a_01,in_RDX,in_RCX);
    a_01[in_RCX] = a_01[in_RCX] - wVar3;
  }
  zzNegMod(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
           in_stack_ffffffffffffff78);
  return local_30;
}

Assistant:

size_t zzAlmostInvMod(word b[], const word a[], const word mod[], size_t n,
	void* stack)
{
	register size_t k = 0;
	size_t nu, nv;
	// переменные в stack
	word* u = (word*)stack;
	word* v = u + n;
	word* da0 = v + n;
	word* da = da0 + n + 1;
	stack = da + n + 1;
	// pre
	ASSERT(!wwIsZero(a, n));
	ASSERT(wwCmp(a, mod, n) < 0);
	ASSERT(wwIsDisjoint(b, mod, n));
	ASSERT(zzIsOdd(mod, n) && mod[n - 1] != 0);
	// da0 <- 1, da <- 0
	wwSetW(da0, n + 1, 1);
	wwSetZero(da, n + 1);
	// u <- a, v <- mod
	wwCopy(u, a, n);
	wwCopy(v, mod, n);
	nu = wwWordSize(u, n);
	nv = n;
	// пока (u != 0)
	do
	{
		// v -- четное?
		if (zzIsEven(v, nv))
		{
			wwShLo(v, nv, 1);
			nv = wwWordSize(v, nv);
			wwShHi(da0, n + 1, 1);
		}
		// u -- четное?
		else if (zzIsEven(u, nu))
		{
			wwShLo(u, nu, 1);
			nu = wwWordSize(u, nu);
			wwShHi(da, n + 1, 1);
		}
		// v > u?
		else if (wwCmp2(v, nv, u, nu) > 0)
		{
			ASSERT(nv >= nu);
			zzSubW2(v + nu, nv - nu, zzSub2(v, u, nu));
			wwShLo(v, nv, 1);
			nv = wwWordSize(v, nv);
			zzAdd2(da, da0, n + 1);
			wwShHi(da0, n + 1, 1);
		}
		// u >= v?
		else
		{
			ASSERT(nu >= nv);
			zzSubW2(u + nv, nu - nv, zzSub2(u, v, nv));
			wwShLo(u, nu, 1);
			nu = wwWordSize(u, nu);
			zzAdd2(da0, da, n + 1);
			wwShHi(da, n + 1, 1);
		}
		// k <- k + 1
		k = k + 1;
	} while (!wwIsZero(u, nu));
	// здесь v == (a, mod)
	EXPECT(wwIsW(v, nv, 1));
	// \gcd(a, mod) != 1? b <- 0
	if (!wwIsW(v, nv, 1))
		wwSetZero(b, n);
	// da >= mod => da -= mod
	if (wwCmp2(da, n + 1, mod, n) >= 0)
		da[n] -= zzSub2(da, mod, n);
	ASSERT(wwCmp2(da, n + 1, mod, n) < 0);
	// b <- mod - da
	zzNegMod(b, da, mod, n);
	// возврат
	return k;
}